

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

Collator * __thiscall
icu_63::RuleBasedCollator::setMaxVariable
          (RuleBasedCollator *this,UColReorderCode group,UErrorCode *errorCode)

{
  UBool UVar1;
  MaxVariable MVar2;
  uint32_t uVar3;
  CollationSettings *this_00;
  CollationSettings *this_01;
  uint32_t varTop;
  CollationSettings *ownedSettings;
  CollationSettings *defaultSettings;
  MaxVariable oldValue;
  int32_t value;
  UErrorCode *errorCode_local;
  UColReorderCode group_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (group == UCOL_REORDER_CODE_DEFAULT) {
      defaultSettings._4_4_ = ~MAX_VAR_SPACE;
    }
    else {
      if ((group < UCOL_REORDER_CODE_FIRST) || (UCOL_REORDER_CODE_CURRENCY < group)) {
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return &this->super_Collator;
      }
      defaultSettings._4_4_ = group - 0x1000;
    }
    MVar2 = CollationSettings::getMaxVariable(this->settings);
    if (defaultSettings._4_4_ == MVar2) {
      setAttributeExplicitly(this,8);
    }
    else {
      this_00 = getDefaultSettings(this);
      if ((this->settings == this_00) && (defaultSettings._4_4_ == ~MAX_VAR_SPACE)) {
        setAttributeDefault(this,8);
      }
      else {
        this_01 = SharedObject::copyOnWrite<icu_63::CollationSettings>(&this->settings);
        if (this_01 == (CollationSettings *)0x0) {
          *errorCode = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          errorCode_local._4_4_ = group;
          if (group == UCOL_REORDER_CODE_DEFAULT) {
            MVar2 = CollationSettings::getMaxVariable(this_00);
            errorCode_local._4_4_ = MVar2 + 0x1000;
          }
          uVar3 = CollationData::getLastPrimaryForGroup(this->data,errorCode_local._4_4_);
          CollationSettings::setMaxVariable
                    (this_01,defaultSettings._4_4_,this_00->options,errorCode);
          UVar1 = ::U_FAILURE(*errorCode);
          if (UVar1 == '\0') {
            this_01->variableTop = uVar3;
            setFastLatinOptions(this,this_01);
            if (defaultSettings._4_4_ == ~MAX_VAR_SPACE) {
              setAttributeDefault(this,8);
            }
            else {
              setAttributeExplicitly(this,8);
            }
          }
        }
      }
    }
  }
  return &this->super_Collator;
}

Assistant:

Collator &
RuleBasedCollator::setMaxVariable(UColReorderCode group, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return *this; }
    // Convert the reorder code into a MaxVariable number, or UCOL_DEFAULT=-1.
    int32_t value;
    if(group == UCOL_REORDER_CODE_DEFAULT) {
        value = UCOL_DEFAULT;
    } else if(UCOL_REORDER_CODE_FIRST <= group && group <= UCOL_REORDER_CODE_CURRENCY) {
        value = group - UCOL_REORDER_CODE_FIRST;
    } else {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return *this;
    }
    CollationSettings::MaxVariable oldValue = settings->getMaxVariable();
    if(value == oldValue) {
        setAttributeExplicitly(ATTR_VARIABLE_TOP);
        return *this;
    }
    const CollationSettings &defaultSettings = getDefaultSettings();
    if(settings == &defaultSettings) {
        if(value == UCOL_DEFAULT) {
            setAttributeDefault(ATTR_VARIABLE_TOP);
            return *this;
        }
    }
    CollationSettings *ownedSettings = SharedObject::copyOnWrite(settings);
    if(ownedSettings == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return *this;
    }

    if(group == UCOL_REORDER_CODE_DEFAULT) {
        group = (UColReorderCode)(UCOL_REORDER_CODE_FIRST + defaultSettings.getMaxVariable());
    }
    uint32_t varTop = data->getLastPrimaryForGroup(group);
    U_ASSERT(varTop != 0);
    ownedSettings->setMaxVariable(value, defaultSettings.options, errorCode);
    if(U_FAILURE(errorCode)) { return *this; }
    ownedSettings->variableTop = varTop;
    setFastLatinOptions(*ownedSettings);
    if(value == UCOL_DEFAULT) {
        setAttributeDefault(ATTR_VARIABLE_TOP);
    } else {
        setAttributeExplicitly(ATTR_VARIABLE_TOP);
    }
    return *this;
}